

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O1

void __thiscall
wasm::TypeUpdating::updateParamTypes
          (TypeUpdating *this,Function *func,
          vector<wasm::Type,_std::allocator<wasm::Type>_> *newParamTypes,Module *wasm,
          LocalUpdatingMode localUpdating)

{
  TypeUpdating *__args;
  uint uVar1;
  LocalSet *pLVar2;
  long *plVar3;
  LocalGet *pLVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  Index IVar7;
  size_type sVar8;
  Type TVar9;
  mapped_type *pmVar10;
  size_t sVar11;
  long lVar12;
  Type TVar13;
  Expression *value;
  Block *pBVar14;
  long *plVar15;
  undefined4 in_register_00000084;
  long *plVar16;
  pointer ppLVar17;
  pointer ppLVar18;
  Index index_1;
  Id index_00;
  ulong uVar19;
  undefined1 auVar20 [8];
  undefined1 auStack_208 [8];
  Index index;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> local_1d8;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_100;
  undefined1 local_c8 [8];
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  paramFixups;
  undefined1 local_88 [8];
  FindAll<wasm::LocalGet> gets;
  FindAll<wasm::LocalSet> sets;
  Builder builder;
  
  TVar13.id = CONCAT44(in_register_00000084,localUpdating);
  local_c8 = (undefined1  [8])&paramFixups._M_h._M_rehash_policy._M_next_resize;
  paramFixups._M_h._M_buckets = (__buckets_ptr)0x1;
  paramFixups._M_h._M_bucket_count = 0;
  paramFixups._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  paramFixups._M_h._M_element_count._0_4_ = 0x3f800000;
  paramFixups._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  paramFixups._M_h._M_rehash_policy._4_4_ = 0;
  paramFixups._M_h._M_rehash_policy._M_next_resize = 0;
  FindAll<wasm::LocalSet>::FindAll
            ((FindAll<wasm::LocalSet> *)
             &gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,*(Expression **)(this + 0x60));
  ppLVar17 = sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((pointer)gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage !=
      sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    ppLVar18 = (pointer)gets.list.
                        super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      pLVar2 = *ppLVar18;
      IVar7 = pLVar2->index;
      auStack_208._0_4_ = IVar7;
      bVar6 = Function::isParam((Function *)this,IVar7);
      if (((bVar6) &&
          (sVar8 = std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)local_c8,(key_type *)auStack_208), sVar8 == 0)) &&
         (bVar6 = wasm::Type::isSubType
                            ((Type)(pLVar2->value->type).id,
                             (Type)*(uintptr_t *)
                                    ((func->super_Importable).super_Named.name.super_IString.str.
                                     _M_len + ((ulong)auStack_208 & 0xffffffff) * 8)), !bVar6)) {
        TVar9 = Function::getLocalType((Function *)this,auStack_208._0_4_);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = TVar9.id;
        IVar7 = Builder::addVar((Builder *)this,(Function *)0x0,(Name)(auVar5 << 0x40),TVar13);
        pmVar10 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_c8,(key_type *)auStack_208);
        *pmVar10 = IVar7;
      }
      ppLVar18 = ppLVar18 + 1;
    } while (ppLVar18 != ppLVar17);
  }
  __args = this + 0x60;
  FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)local_88,*(Expression **)__args);
  if (paramFixups._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    auStack_208 = (undefined1  [8])0x0;
    _index = (Expression **)0x0;
    local_1f8._M_p = (pointer)0x0;
    uVar19 = 0;
    sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)newParamTypes;
    while( true ) {
      sVar11 = Function::getNumParams((Function *)this);
      index_00 = (Id)uVar19;
      if (sVar11 <= uVar19) break;
      plVar3 = *(long **)((long)local_c8 + (uVar19 % (ulong)paramFixups._M_h._M_buckets) * 8);
      plVar15 = (long *)0x0;
      if ((plVar3 != (long *)0x0) &&
         (plVar15 = plVar3, plVar16 = (long *)*plVar3, index_00 != *(Id *)((long *)*plVar3 + 1))) {
        while (plVar3 = (long *)*plVar16, plVar3 != (long *)0x0) {
          plVar15 = (long *)0x0;
          if (((ulong)*(Id *)(plVar3 + 1) % (ulong)paramFixups._M_h._M_buckets !=
               uVar19 % (ulong)paramFixups._M_h._M_buckets) ||
             (plVar15 = plVar16, plVar16 = plVar3, index_00 == *(Id *)(plVar3 + 1)))
          goto LAB_00aaf3e0;
        }
        plVar15 = (long *)0x0;
      }
LAB_00aaf3e0:
      if (plVar15 == (long *)0x0) {
        lVar12 = 0;
      }
      else {
        lVar12 = *plVar15;
      }
      if (lVar12 != 0) {
        IVar7 = *(Index *)(lVar12 + 0xc);
        if ((int)wasm == 0) {
          TVar13.id = *(uintptr_t *)
                       ((func->super_Importable).super_Named.name.super_IString.str._M_len +
                       uVar19 * 8);
        }
        else {
          TVar13 = Function::getLocalType((Function *)this,index_00);
        }
        value = (Expression *)
                MixedArena::allocSpace
                          ((MixedArena *)
                           (sets.list.
                            super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 0x2b),0x18,8);
        value->_id = LocalGetId;
        value[1]._id = index_00;
        (value->type).id = TVar13.id;
        paramFixups._M_h._M_single_bucket =
             (__node_base_ptr)
             Builder::makeLocalSet
                       ((Builder *)
                        &sets.list.
                         super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,IVar7,value);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_208,
                   (Expression **)&paramFixups._M_h._M_single_bucket);
      }
      uVar19 = (ulong)(index_00 + BlockId);
    }
    if (_index == (Expression **)local_1f8._M_p) {
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      _M_realloc_insert<wasm::Expression*const&>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_208,_index,
                 (Expression **)__args);
    }
    else {
      *_index = *(Expression **)__args;
      _index = _index + 1;
    }
    pBVar14 = Builder::
              makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                        ((Builder *)
                         &sets.list.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         auStack_208);
    *(Block **)__args = pBVar14;
    for (auVar20 = local_88;
        ppLVar17 = (pointer)gets.list.
                            super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
        auVar20 !=
        (undefined1  [8])
        gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
        super__Vector_impl_data._M_start; auVar20 = (undefined1  [8])((long)auVar20 + 8)) {
      uVar1 = (*(LocalGet **)auVar20)->index;
      plVar3 = *(long **)((long)local_c8 + ((ulong)uVar1 % (ulong)paramFixups._M_h._M_buckets) * 8);
      plVar15 = (long *)0x0;
      if ((plVar3 != (long *)0x0) &&
         (plVar15 = plVar3, plVar16 = (long *)*plVar3, uVar1 != *(uint *)((long *)*plVar3 + 1))) {
        while (plVar3 = (long *)*plVar16, plVar3 != (long *)0x0) {
          plVar15 = (long *)0x0;
          if (((ulong)*(uint *)(plVar3 + 1) % (ulong)paramFixups._M_h._M_buckets !=
               (ulong)uVar1 % (ulong)paramFixups._M_h._M_buckets) ||
             (plVar15 = plVar16, plVar16 = plVar3, uVar1 == *(uint *)(plVar3 + 1)))
          goto LAB_00aaf52a;
        }
        plVar15 = (long *)0x0;
      }
LAB_00aaf52a:
      if (plVar15 == (long *)0x0) {
        lVar12 = 0;
      }
      else {
        lVar12 = *plVar15;
      }
      if (lVar12 != 0) {
        (*(LocalGet **)auVar20)->index = *(Index *)(lVar12 + 0xc);
      }
    }
    for (; ppLVar17 !=
           sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl
           .super__Vector_impl_data._M_start; ppLVar17 = ppLVar17 + 1) {
      uVar1 = (*ppLVar17)->index;
      plVar3 = *(long **)((long)local_c8 + ((ulong)uVar1 % (ulong)paramFixups._M_h._M_buckets) * 8);
      plVar15 = (long *)0x0;
      if ((plVar3 != (long *)0x0) &&
         (plVar15 = plVar3, plVar16 = (long *)*plVar3, uVar1 != *(uint *)((long *)*plVar3 + 1))) {
        while (plVar3 = (long *)*plVar16, plVar3 != (long *)0x0) {
          plVar15 = (long *)0x0;
          if (((ulong)*(uint *)(plVar3 + 1) % (ulong)paramFixups._M_h._M_buckets !=
               (ulong)uVar1 % (ulong)paramFixups._M_h._M_buckets) ||
             (plVar15 = plVar16, plVar16 = plVar3, uVar1 == *(uint *)(plVar3 + 1)))
          goto LAB_00aaf5c0;
        }
        plVar15 = (long *)0x0;
      }
LAB_00aaf5c0:
      if (plVar15 == (long *)0x0) {
        lVar12 = 0;
      }
      else {
        lVar12 = *plVar15;
      }
      if (lVar12 != 0) {
        (*ppLVar17)->index = *(Index *)(lVar12 + 0xc);
      }
    }
    if (auStack_208 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_208,(long)local_1f8._M_p - (long)auStack_208);
    }
  }
  auVar20 = local_88;
  if ((int)wasm == 0) {
    for (; ppLVar17 = (pointer)gets.list.
                               super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
        auVar20 !=
        (undefined1  [8])
        gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
        super__Vector_impl_data._M_start; auVar20 = (undefined1  [8])((long)auVar20 + 8)) {
      pLVar4 = *(LocalGet **)auVar20;
      uVar1 = pLVar4->index;
      bVar6 = Function::isParam((Function *)this,uVar1);
      if (bVar6) {
        (pLVar4->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             *(uintptr_t *)
              ((func->super_Importable).super_Named.name.super_IString.str._M_len + (ulong)uVar1 * 8
              );
      }
    }
    for (; ppLVar17 !=
           sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl
           .super__Vector_impl_data._M_start; ppLVar17 = ppLVar17 + 1) {
      pLVar2 = *ppLVar17;
      uVar1 = pLVar2->index;
      bVar6 = Function::isParam((Function *)this,uVar1);
      if ((bVar6) && (bVar6 = LocalSet::isTee(pLVar2), bVar6)) {
        (pLVar2->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id =
             *(uintptr_t *)
              ((func->super_Importable).super_Named.name.super_IString.str._M_len + (ulong)uVar1 * 8
              );
        LocalSet::finalize(pLVar2);
      }
    }
  }
  ReFinalize::ReFinalize((ReFinalize *)auStack_208);
  local_1d8.currFunction = (Function *)this;
  local_1d8.currModule = (Module *)newParamTypes;
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
            (&local_1d8,(Expression **)__args);
  local_1d8.currFunction = (Function *)0x0;
  local_1d8.currModule = (Module *)0x0;
  auStack_208 = (undefined1  [8])&PTR__ReFinalize_00d870a0;
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_100);
  if (local_1d8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  auStack_208 = (undefined1  [8])&PTR__Pass_00d87048;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_p != &local_1e8) {
    operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
  }
  if (paramFixups._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    handleNonDefaultableLocals((Function *)this,(Module *)newParamTypes);
  }
  if (local_88 != (undefined1  [8])0x0) {
    operator_delete((void *)local_88,
                    (long)gets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_88);
  }
  if (gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(gets.list.
                    super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)sets.list.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)gets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_c8);
  return;
}

Assistant:

void updateParamTypes(Function* func,
                      const std::vector<Type>& newParamTypes,
                      Module& wasm,
                      LocalUpdatingMode localUpdating) {
  // Before making this update, we must be careful if the param was "reused",
  // specifically, if it is assigned a less-specific type in the body then
  // we'd get a validation error when we refine it. To handle that, if a less-
  // specific type is assigned simply switch to a new local, that is, we can
  // do a fixup like this:
  //
  // function foo(x : oldType) {
  //   ..
  //   x = (oldType)val;
  //
  // =>
  //
  // function foo(x : newType) {
  //   var x_oldType = x; // assign the param immediately to a fixup var
  //   ..
  //   x_oldType = (oldType)val; // fixup var is used throughout the body
  //
  // Later optimization passes may be able to remove the extra var, and can
  // take advantage of the refined argument type while doing so.

  // A map of params that need a fixup to the new fixup var used for it.
  std::unordered_map<Index, Index> paramFixups;

  FindAll<LocalSet> sets(func->body);

  for (auto* set : sets.list) {
    auto index = set->index;
    if (func->isParam(index) && !paramFixups.count(index) &&
        !Type::isSubType(set->value->type, newParamTypes[index])) {
      paramFixups[index] = Builder::addVar(func, func->getLocalType(index));
    }
  }

  FindAll<LocalGet> gets(func->body);

  // Apply the fixups we identified that we need.
  if (!paramFixups.empty()) {
    // Write the params immediately to the fixups.
    Builder builder(wasm);
    std::vector<Expression*> contents;
    for (Index index = 0; index < func->getNumParams(); index++) {
      auto iter = paramFixups.find(index);
      if (iter != paramFixups.end()) {
        auto fixup = iter->second;
        contents.push_back(builder.makeLocalSet(
          fixup,
          builder.makeLocalGet(index,
                               localUpdating == Update
                                 ? newParamTypes[index]
                                 : func->getLocalType(index))));
      }
    }
    contents.push_back(func->body);
    func->body = builder.makeBlock(contents);

    // Update gets and sets using the param to use the fixup.
    for (auto* get : gets.list) {
      auto iter = paramFixups.find(get->index);
      if (iter != paramFixups.end()) {
        get->index = iter->second;
      }
    }
    for (auto* set : sets.list) {
      auto iter = paramFixups.find(set->index);
      if (iter != paramFixups.end()) {
        set->index = iter->second;
      }
    }
  }

  // Update local.get/local.tee operations that use the modified param type.
  if (localUpdating == Update) {
    for (auto* get : gets.list) {
      auto index = get->index;
      if (func->isParam(index)) {
        get->type = newParamTypes[index];
      }
    }
    for (auto* set : sets.list) {
      auto index = set->index;
      if (func->isParam(index) && set->isTee()) {
        set->type = newParamTypes[index];
        set->finalize();
      }
    }
  }

  // Propagate the new get and set types outwards.
  ReFinalize().walkFunctionInModule(func, &wasm);

  if (!paramFixups.empty()) {
    // We have added locals, and must handle non-nullability of them.
    TypeUpdating::handleNonDefaultableLocals(func, wasm);
  }
}